

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

PrimitiveInstantiationSyntax * __thiscall
slang::parsing::Parser::parsePrimitiveInstantiation(Parser *this,AttrList attributes)

{
  bool bVar1;
  SyntaxNode *this_00;
  Diagnostic *pDVar2;
  SourceLocation location;
  HierarchicalInstanceSyntax *pHVar3;
  PrimitiveInstantiationSyntax *pPVar4;
  uint uVar5;
  Info *pIVar6;
  Info *extraout_RDX;
  Info *pIVar7;
  DiagCode code;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *attributes_00;
  TokenKind TVar8;
  ulong uVar9;
  TokenKind kind;
  Token TVar10;
  SourceRange SVar11;
  string_view sVar12;
  Token TVar13;
  Token local_1b8;
  DriveStrengthSyntax *local_1a8;
  Token semi;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_178;
  ulong local_168;
  undefined8 uStack_160;
  size_t local_158;
  pointer local_150;
  size_t local_148;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> items;
  
  Token::Token(&local_1b8);
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isGateType(TVar10.kind);
  if (bVar1) {
    local_1b8 = ParserBase::consume(&this->super_ParserBase);
  }
  else {
    local_1b8 = ParserBase::expect(&this->super_ParserBase,Identifier);
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    TVar10 = ParserBase::peek(&this->super_ParserBase,1);
    bVar1 = slang::syntax::SyntaxFacts::isDriveStrength(TVar10.kind);
    if (!bVar1) goto LAB_003d8332;
    if ((local_1b8.kind & ~EndOfFile) == PullDownKeyword) {
      local_1a8 = (DriveStrengthSyntax *)parsePullStrength(this,local_1b8);
    }
    else {
      local_1a8 = parseDriveStrength(this);
      if ((((local_1b8.kind - 0xdf < 0x2d) &&
           ((0x1f0040001001U >> ((ulong)(local_1b8.kind - 0xdf) & 0x3f) & 1) != 0)) ||
          (local_1b8.kind - 0x12f < 3)) || (local_1b8.kind == CmosKeyword)) {
        SVar11 = Token::range(&local_1b8);
        pDVar2 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x240005,SVar11);
        sVar12 = Token::valueText(&local_1b8);
        pDVar2 = Diagnostic::operator<<(pDVar2,sVar12);
        SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_1a8);
        Diagnostic::operator<<(pDVar2,SVar11);
      }
    }
  }
  else {
LAB_003d8332:
    local_1a8 = (DriveStrengthSyntax *)0x0;
  }
  this_00 = &parseDelay3(this)->super_SyntaxNode;
  if (this_00 != (SyntaxNode *)0x0) {
    uVar5 = local_1b8.kind - 0xda;
    if (uVar5 < 0x32) {
      if ((0x3000000001141U >> ((ulong)uVar5 & 0x3f) & 1) != 0) goto LAB_003d83a6;
      if ((0x80000c000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) goto LAB_003d8383;
LAB_003d8492:
      SVar11 = slang::syntax::SyntaxNode::sourceRange(this_00);
      code.subsystem = Parser;
      code.code = 0x1e;
LAB_003d84a5:
      pDVar2 = ParserBase::addDiag(&this->super_ParserBase,code,SVar11);
      sVar12 = Token::valueText(&local_1b8);
      pDVar2 = Diagnostic::operator<<(pDVar2,sVar12);
      SVar11 = Token::range(&local_1b8);
      Diagnostic::operator<<(pDVar2,SVar11);
    }
    else {
LAB_003d8383:
      uVar5 = local_1b8.kind - 0x12f;
      if (uVar5 < 0x26) {
        if ((0x3000000006U >> ((ulong)uVar5 & 0x3f) & 1) != 0) goto LAB_003d83a6;
        if ((ulong)uVar5 == 0) goto LAB_003d8492;
      }
      if (((local_1b8.kind == Identifier) || (local_1b8.kind == AndKeyword)) ||
         (local_1b8.kind == BufKeyword)) {
LAB_003d83a6:
        if ((this_00->kind == Delay3) && (this_00[4].parent != (SyntaxNode *)0x0)) {
          SVar11 = slang::syntax::SyntaxNode::sourceRange(this_00[4].parent);
          if (local_1b8.kind != Identifier) {
            code.subsystem = Parser;
            code.code = 0x1c;
            goto LAB_003d84a5;
          }
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x1d0005,SVar11);
        }
      }
    }
  }
  Token::Token(&semi);
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  current = TVar10;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar10.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x400005,location);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleInstance(TVar10.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar10,Semicolon,&semi,(DiagCode)0x400005);
      pIVar7 = extraout_RDX;
      goto LAB_003d86a7;
    }
    do {
      do {
        pIVar7 = TVar10.info;
        pHVar3 = parseHierarchicalInstance(this);
        local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pHVar3;
        local_168 = CONCAT71(local_168._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_178._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar13.kind);
        if (TVar13.kind != Comma || bVar1) goto LAB_003d8692;
        local_178._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_168 = local_168 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_178._M_first);
        TVar13 = ParserBase::peek(&this->super_ParserBase);
        pIVar6 = TVar13.info;
        kind = TVar13.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_003d8692;
        }
        TVar8 = TVar10.kind;
        uVar9 = TVar13._0_8_ & 0xffffffff;
        TVar10.info = pIVar6;
        TVar10.kind = (short)uVar9;
        TVar10._2_1_ = (char)(uVar9 >> 0x10);
        TVar10.numFlags.raw = (char)(uVar9 >> 0x18);
        TVar10.rawLen = (int)(uVar9 >> 0x20);
      } while (pIVar7 != pIVar6 || TVar8 != kind);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleInstance,&slang::syntax::SyntaxFacts::isSemicolon>
                        (&this->super_ParserBase,(DiagCode)0x400005,true);
      uVar9 = TVar13._0_8_ & 0xffffffff;
      TVar10.kind = (short)uVar9;
      TVar10._2_1_ = (char)(uVar9 >> 0x10);
      TVar10.numFlags.raw = (char)(uVar9 >> 0x18);
      TVar10.rawLen = (int)(uVar9 >> 0x20);
    } while (bVar1);
  }
LAB_003d8692:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar7 = semi.info;
LAB_003d86a7:
  TVar10 = local_1b8;
  local_178._8_4_ = 1;
  local_168 = 0;
  uStack_160 = 0;
  local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00678c10;
  local_158 = attributes._M_extent._M_extent_value._M_extent_value;
  local_150 = attributes._M_ptr;
  local_148 = attributes._M_extent._M_extent_value._M_extent_value;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar7);
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_006791b8;
  attributes_00 = &local_178;
  pPVar4 = slang::syntax::SyntaxFactory::primitiveInstantiation
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&attributes_00->_M_first
                      ,TVar10,&local_1a8->super_NetStrengthSyntax,(TimingControlSyntax *)this_00,
                      (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)&current,
                      semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&items.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&attributes_00->_M_first);
  return pPVar4;
}

Assistant:

PrimitiveInstantiationSyntax& Parser::parsePrimitiveInstantiation(AttrList attributes) {
    Token type;
    if (isGateType(peek().kind))
        type = consume();
    else
        type = expect(TokenKind::Identifier);

    NetStrengthSyntax* strength = nullptr;
    if (peek(TokenKind::OpenParenthesis) && isDriveStrength(peek(1).kind)) {
        if (type.kind == TokenKind::PullUpKeyword || type.kind == TokenKind::PullDownKeyword)
            strength = parsePullStrength(type);
        else {
            strength = parseDriveStrength();
            SLANG_ASSERT(strength);
            switch (type.kind) {
                case TokenKind::CmosKeyword:
                case TokenKind::RcmosKeyword:
                case TokenKind::NmosKeyword:
                case TokenKind::PmosKeyword:
                case TokenKind::RnmosKeyword:
                case TokenKind::RpmosKeyword:
                case TokenKind::TranIf0Keyword:
                case TokenKind::TranIf1Keyword:
                case TokenKind::RtranIf0Keyword:
                case TokenKind::RtranIf1Keyword:
                case TokenKind::TranKeyword:
                case TokenKind::RtranKeyword:
                    addDiag(diag::DriveStrengthNotAllowed, type.range())
                        << type.valueText() << strength->sourceRange();
                    break;
                default:
                    break;
            }
        }
    }

    auto delay = parseDelay3();
    if (delay) {
        switch (type.kind) {
            case TokenKind::PullDownKeyword:
            case TokenKind::PullUpKeyword:
            case TokenKind::TranKeyword:
            case TokenKind::RtranKeyword:
                addDiag(diag::DelaysNotAllowed, delay->sourceRange())
                    << type.valueText() << type.range();
                break;
            case TokenKind::AndKeyword:
            case TokenKind::NandKeyword:
            case TokenKind::OrKeyword:
            case TokenKind::NorKeyword:
            case TokenKind::XorKeyword:
            case TokenKind::XnorKeyword:
            case TokenKind::BufKeyword:
            case TokenKind::NotKeyword:
            case TokenKind::TranIf0Keyword:
            case TokenKind::TranIf1Keyword:
            case TokenKind::RtranIf0Keyword:
            case TokenKind::RtranIf1Keyword:
            case TokenKind::Identifier:
                if (delay->kind == SyntaxKind::Delay3) {
                    if (auto d3 = delay->as<Delay3Syntax>().delay3) {
                        auto range = d3->sourceRange();
                        if (type.kind == TokenKind::Identifier) {
                            addDiag(diag::Delay3UdpNotAllowed, range);
                        }
                        else {
                            addDiag(diag::Delay3NotAllowed, range)
                                << type.valueText() << type.range();
                        }
                    }
                }
                break;
            default:
                break;
        }
    }

    Token semi;
    SmallVector<TokenOrSyntax, 8> items;
    parseList<isPossibleInstance, isSemicolon>(items, TokenKind::Semicolon, TokenKind::Comma, semi,
                                               RequireItems::True,
                                               diag::ExpectedHierarchicalInstantiation,
                                               [this] { return &parseHierarchicalInstance(); });

    return factory.primitiveInstantiation(attributes, type, strength, delay, items.copy(alloc),
                                          semi);
}